

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O1

ostream * QuantLib::operator<<(ostream *out,Type ec)

{
  long lVar1;
  char *pcVar2;
  
  switch(ec) {
  case None:
    pcVar2 = "None";
    lVar1 = 4;
    break;
  case MaxIterations:
    pcVar2 = "MaxIterations";
    lVar1 = 0xd;
    break;
  case StationaryPoint:
    pcVar2 = "StationaryPoint";
    lVar1 = 0xf;
    break;
  case StationaryFunctionValue:
    pcVar2 = "StationaryFunctionValue";
    lVar1 = 0x17;
    break;
  case StationaryFunctionAccuracy:
    pcVar2 = "StationaryFunctionAccuracy";
    lVar1 = 0x1a;
    break;
  case ZeroGradientNorm:
    pcVar2 = "ZeroGradientNorm";
    lVar1 = 0x10;
    break;
  case Unknown:
    pcVar2 = "Unknown";
    lVar1 = 7;
    break;
  default:
    snprintf(painCave.errMsg,2000,"unknown EndCriteria::Type ( %d )\n");
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    return out;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, EndCriteria::Type ec) {
    switch (ec) {
    case QuantLib::EndCriteria::None:
      return out << "None";
    case QuantLib::EndCriteria::MaxIterations:
      return out << "MaxIterations";
    case QuantLib::EndCriteria::StationaryPoint:
      return out << "StationaryPoint";
    case QuantLib::EndCriteria::StationaryFunctionValue:
      return out << "StationaryFunctionValue";
    case QuantLib::EndCriteria::StationaryFunctionAccuracy:
      return out << "StationaryFunctionAccuracy";
    case QuantLib::EndCriteria::ZeroGradientNorm:
      return out << "ZeroGradientNorm";
    case QuantLib::EndCriteria::Unknown:
      return out << "Unknown";
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "unknown EndCriteria::Type ( %d )\n", int(ec));
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
    return out;
  }